

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_reshape(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  int *piVar1;
  undefined1 auVar2 [32];
  undefined4 extraout_EAX;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *extraout_RAX;
  uint uVar5;
  ggml_tensor *in_RCX;
  size_t sVar6;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  int32_t value;
  int extraout_EDX_02;
  ggml_tensor *extraout_RDX;
  ggml_tensor *extraout_RDX_00;
  ggml_tensor *extraout_RDX_01;
  ggml_tensor *extraout_RDX_02;
  ggml_tensor *extraout_RDX_03;
  ggml_tensor *tensor;
  uint uVar7;
  ggml_tensor *pgVar8;
  uint uVar9;
  ggml_tensor *pgVar10;
  ulong unaff_R12;
  ggml_tensor *unaff_R14;
  int iStack_198;
  int iStack_194;
  undefined8 uStack_190;
  ggml_tensor *pgStack_180;
  ggml_tensor *pgStack_178;
  ggml_type gStack_170;
  int iStack_16c;
  undefined8 uStack_168;
  ggml_tensor *pgStack_158;
  ggml_tensor *pgStack_150;
  undefined4 uStack_148;
  int iStack_144;
  ggml_tensor *pgStack_140;
  ulong uStack_138;
  ggml_type gStack_e0;
  int iStack_dc;
  ggml_tensor *pgStack_d8;
  ggml_tensor *pgStack_d0;
  ggml_tensor *pgStack_c8;
  undefined1 auStack_c0 [16];
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  ggml_tensor *pgStack_a0;
  int iStack_78;
  int iStack_74;
  undefined8 uStack_70;
  ggml_tensor *pgStack_68;
  int iStack_44;
  ggml_tensor *pgStack_40;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  ggml_tensor *pgStack_28;
  int iStack_18;
  int iStack_14;
  ggml_tensor *pgStack_10;
  
  pgVar3 = (ggml_tensor *)(ulong)a->type;
  if ((((a->nb[0] == GGML_TYPE_SIZE[(long)pgVar3]) &&
       (in_RCX = b,
       a->nb[1] == (a->nb[0] * (long)a->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[(long)pgVar3])) &&
      (a->nb[2] == a->nb[1] * (long)a->ne[1])) && (a->nb[3] == a->nb[2] * (long)a->ne[2])) {
    if (((b->nb[0] != GGML_TYPE_SIZE[b->type]) ||
        (b->nb[1] != (b->nb[0] * (long)b->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[b->type])) ||
       ((b->nb[2] != b->nb[1] * (long)b->ne[1] || (b->nb[3] != b->nb[2] * (long)b->ne[2]))))
    goto LAB_00120abc;
    if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] == b->ne[1] * b->ne[0] * b->ne[2] * b->ne[3]) {
      if ((a->grad == (ggml_tensor *)0x0) && (b->grad == (ggml_tensor *)0x0)) {
        pgStack_10 = (ggml_tensor *)0x120aa0;
        pgVar3 = ggml_new_tensor_impl(ctx,a->type,b->n_dims,b->ne,a->data);
        pgVar3->op = GGML_OP_RESHAPE;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = a;
        pgVar3->src1 = (ggml_tensor *)0x0;
        return pgVar3;
      }
      goto LAB_00120ac1;
    }
  }
  else {
    b = in_RCX;
    pgStack_10 = (ggml_tensor *)0x120abc;
    ggml_reshape_cold_1();
LAB_00120abc:
    pgStack_10 = (ggml_tensor *)0x120ac1;
    ggml_reshape_cold_2();
LAB_00120ac1:
    pgStack_10 = (ggml_tensor *)0x120ac6;
    ggml_reshape_cold_4();
  }
  pgStack_10 = (ggml_tensor *)ggml_reshape_2d;
  ggml_reshape_cold_3();
  pgVar8 = (ggml_tensor *)(ulong)extraout_EDX;
  pgVar4 = (ggml_tensor *)(ulong)pgVar3->type;
  pgStack_10 = a;
  if ((((pgVar3->nb[0] == GGML_TYPE_SIZE[(long)pgVar4]) &&
       (pgVar3->nb[1] ==
        (pgVar3->nb[0] * (long)pgVar3->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[(long)pgVar4])) &&
      (pgVar3->nb[2] == pgVar3->nb[1] * (long)pgVar3->ne[1])) &&
     (pgVar3->nb[3] == pgVar3->nb[2] * (long)pgVar3->ne[2])) {
    iStack_14 = (int)b;
    if (pgVar3->ne[1] * pgVar3->ne[0] * pgVar3->ne[2] * pgVar3->ne[3] != iStack_14 * extraout_EDX)
    goto LAB_00120b8c;
    if (pgVar3->grad == (ggml_tensor *)0x0) {
      pgStack_28 = (ggml_tensor *)0x120b6c;
      pgVar4 = ggml_new_tensor_impl(ctx,pgVar3->type,2,&iStack_18,pgVar3->data);
      pgVar4->op = GGML_OP_RESHAPE;
      pgVar4->grad = (ggml_tensor *)0x0;
      pgVar4->src0 = pgVar3;
      pgVar4->src1 = (ggml_tensor *)0x0;
      return pgVar4;
    }
  }
  else {
    pgStack_28 = (ggml_tensor *)0x120b8c;
    ggml_reshape_2d_cold_1();
LAB_00120b8c:
    pgStack_28 = (ggml_tensor *)0x120b91;
    ggml_reshape_2d_cold_2();
  }
  pgStack_28 = (ggml_tensor *)ggml_reshape_3d;
  ggml_reshape_2d_cold_3();
  pgVar10 = (ggml_tensor *)(ulong)extraout_EDX_00;
  tensor = (ggml_tensor *)(ulong)pgVar4->type;
  pgStack_28 = pgVar3;
  if (((pgVar4->nb[0] == GGML_TYPE_SIZE[(long)tensor]) &&
      (pgVar4->nb[1] ==
       (pgVar4->nb[0] * (long)pgVar4->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[(long)tensor])) &&
     ((pgVar4->nb[2] == pgVar4->nb[1] * (long)pgVar4->ne[1] &&
      (pgVar4->nb[3] == pgVar4->nb[2] * (long)pgVar4->ne[2])))) {
    iStack_30 = (int)b;
    iStack_2c = (int)pgVar8;
    if (pgVar4->ne[1] * pgVar4->ne[0] * pgVar4->ne[2] * pgVar4->ne[3] !=
        iStack_30 * extraout_EDX_00 * iStack_2c) goto LAB_00120c63;
    if (pgVar4->grad == (ggml_tensor *)0x0) {
      pgStack_40 = (ggml_tensor *)0x120c43;
      pgVar3 = ggml_new_tensor_impl(ctx,pgVar4->type,3,&iStack_34,pgVar4->data);
      pgVar3->op = GGML_OP_RESHAPE;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = pgVar4;
      pgVar3->src1 = (ggml_tensor *)0x0;
      return pgVar3;
    }
  }
  else {
    pgStack_40 = (ggml_tensor *)0x120c63;
    ggml_reshape_3d_cold_1();
LAB_00120c63:
    pgStack_40 = (ggml_tensor *)0x120c68;
    ggml_reshape_3d_cold_2();
  }
  pgStack_40 = (ggml_tensor *)ggml_view_1d;
  ggml_reshape_3d_cold_3();
  pgStack_40 = pgVar4;
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl
                       (ctx,tensor->type,1,&iStack_44,
                        (void *)((long)tensor->data + (long)(b->ne + -2)));
    pgVar3->op = GGML_OP_VIEW;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_view_1d_cold_1();
  pgStack_68 = pgVar4;
  if (tensor->grad == (ggml_tensor *)0x0) {
    uStack_70 = 0x100000001;
    iStack_74 = (int)b;
    pgVar3 = ggml_new_tensor_impl
                       (ctx,tensor->type,2,&iStack_78,
                        (void *)((long)tensor->data + (long)(pgVar10->ne + -2)));
    pgVar3->nb[1] = (size_t)pgVar8;
    sVar6 = (long)(int)b * (long)pgVar8;
    pgVar3->nb[2] = sVar6;
    pgVar3->nb[3] = sVar6;
    pgVar3->op = GGML_OP_VIEW;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_view_2d_cold_1();
  pgStack_a0 = pgVar4;
  if (extraout_EDX_01 < 4) {
    uVar5 = (uint)b;
    if (3 < uVar5) goto LAB_00120e4d;
    uVar7 = (uint)pgVar8;
    unaff_R14 = (ggml_tensor *)((ulong)pgVar8 & 0xffffffff);
    if (3 < uVar7) goto LAB_00120e52;
    uVar9 = (uint)pgVar10;
    if (3 < uVar9) goto LAB_00120e57;
    unaff_R12 = (ulong)extraout_EDX_01;
    if (extraout_EDX_01 == uVar5) goto LAB_00120e5c;
    if (extraout_EDX_01 == uVar7) goto LAB_00120e61;
    if (extraout_EDX_01 == uVar9) goto LAB_00120e66;
    if (uVar5 == uVar7) goto LAB_00120e6b;
    if (uVar5 == uVar9) goto LAB_00120e70;
    if (uVar7 == uVar9) goto LAB_00120e75;
    pgVar4 = tensor;
    if (tensor->grad == (ggml_tensor *)0x0) {
      pgStack_c8 = (ggml_tensor *)0x120dcb;
      pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
      *(int *)((long)&uStack_b0 + unaff_R12 * 4) = tensor->ne[0];
      *(int *)((long)&uStack_b0 + ((ulong)b & 0xffffffff) * 4) = tensor->ne[1];
      *(int *)((long)&uStack_b0 + ((ulong)pgVar8 & 0xffffffff) * 4) = tensor->ne[2];
      *(int *)((long)&uStack_b0 + ((ulong)pgVar10 & 0xffffffff) * 4) = tensor->ne[3];
      *(int *)(auStack_c0 + unaff_R12 * 4) = (int)tensor->nb[0];
      *(int *)(auStack_c0 + ((ulong)b & 0xffffffff) * 4) = (int)tensor->nb[1];
      *(int *)(auStack_c0 + ((ulong)pgVar8 & 0xffffffff) * 4) = (int)tensor->nb[2];
      *(int *)(auStack_c0 + ((ulong)pgVar10 & 0xffffffff) * 4) = (int)tensor->nb[3];
      *(undefined8 *)pgVar3->ne = uStack_b0;
      *(undefined8 *)(pgVar3->ne + 2) = uStack_a8;
      auVar2 = vpmovsxdq_avx2(auStack_c0);
      *(undefined1 (*) [32])pgVar3->nb = auVar2;
      pgVar3->op = GGML_OP_PERMUTE;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = (ggml_tensor *)0x0;
      return pgVar3;
    }
  }
  else {
    pgStack_c8 = (ggml_tensor *)0x120e4d;
    ggml_permute_cold_1();
LAB_00120e4d:
    pgStack_c8 = (ggml_tensor *)0x120e52;
    ggml_permute_cold_2();
LAB_00120e52:
    pgStack_c8 = (ggml_tensor *)0x120e57;
    ggml_permute_cold_3();
LAB_00120e57:
    pgStack_c8 = (ggml_tensor *)0x120e5c;
    ggml_permute_cold_4();
LAB_00120e5c:
    pgStack_c8 = (ggml_tensor *)0x120e61;
    ggml_permute_cold_11();
LAB_00120e61:
    pgStack_c8 = (ggml_tensor *)0x120e66;
    ggml_permute_cold_10();
LAB_00120e66:
    pgStack_c8 = (ggml_tensor *)0x120e6b;
    ggml_permute_cold_9();
LAB_00120e6b:
    pgStack_c8 = (ggml_tensor *)0x120e70;
    ggml_permute_cold_8();
LAB_00120e70:
    pgStack_c8 = (ggml_tensor *)0x120e75;
    ggml_permute_cold_7();
LAB_00120e75:
    pgStack_c8 = (ggml_tensor *)0x120e7a;
    ggml_permute_cold_6();
  }
  pgStack_c8 = (ggml_tensor *)ggml_transpose;
  ggml_permute_cold_5();
  pgStack_c8 = pgVar4;
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgStack_d0 = (ggml_tensor *)0x120e9f;
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
    pgVar3->ne[0] = tensor->ne[1];
    pgVar3->ne[1] = tensor->ne[0];
    pgVar3->nb[0] = tensor->nb[1];
    pgVar3->nb[1] = tensor->nb[0];
    pgVar3->op = GGML_OP_TRANSPOSE;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  pgStack_d0 = (ggml_tensor *)ggml_get_rows;
  ggml_transpose_cold_1();
  pgVar3 = unaff_R14;
  pgStack_d8 = pgVar4;
  pgStack_d0 = unaff_R14;
  if (((tensor->ne[2] == 1) && (pgVar3 = tensor, tensor->ne[3] == 1)) &&
     ((pgVar4 = extraout_RDX, extraout_RDX->ne[1] == 1 &&
      (((extraout_RDX->ne[2] == 1 && (extraout_RDX->ne[3] == 1)) &&
       (extraout_RDX->type == GGML_TYPE_I32)))))) {
    if ((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX->grad == (ggml_tensor *)0x0)) {
      _gStack_e0 = CONCAT44(extraout_RDX->ne[0],tensor->ne[0]);
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_e0,(void *)0x0);
      pgVar3->op = GGML_OP_GET_ROWS;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = extraout_RDX;
      return pgVar3;
    }
  }
  else {
    ggml_get_rows_cold_1();
  }
  ggml_get_rows_cold_2();
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
    pgVar4 = ggml_new_i32(ctx,value);
    pgVar3->op = GGML_OP_DIAG_MASK_INF;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = pgVar4;
    return pgVar3;
  }
  ggml_diag_mask_inf_cold_1();
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
    pgVar3->op = GGML_OP_SOFT_MAX;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_soft_max_cold_1();
  pgStack_140 = pgVar4;
  uStack_138 = unaff_R12;
  if (extraout_EDX_02 < 0) {
    pgStack_150 = (ggml_tensor *)0x1210a0;
    ggml_rope_cold_1();
    pgStack_158 = pgVar4;
  }
  else {
    pgStack_158 = tensor;
    if (tensor->grad == (ggml_tensor *)0x0) {
      pgStack_150 = (ggml_tensor *)0x12103d;
      uStack_148 = extraout_EAX;
      pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
      _uStack_148 = CONCAT44(3,uStack_148);
      pgStack_150 = (ggml_tensor *)0x121060;
      pgVar4 = ggml_new_tensor_impl(ctx,GGML_TYPE_I32,1,&iStack_144,(void *)0x0);
      piVar1 = (int *)pgVar4->data;
      *piVar1 = extraout_EDX_02;
      piVar1[1] = (int)b;
      piVar1[2] = (int)pgVar8;
      pgVar3->op = GGML_OP_ROPE;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = pgVar4;
      return pgVar3;
    }
  }
  pgStack_150 = (ggml_tensor *)ggml_conv_1d_1s;
  ggml_rope_cold_2();
  pgVar4 = pgStack_158;
  pgStack_150 = pgVar3;
  if ((extraout_RDX_00->ne[2] == 1) && (pgVar4 = extraout_RDX_00, extraout_RDX_00->ne[3] == 1)) {
    pgVar3 = tensor;
    if (tensor->ne[1] != extraout_RDX_00->ne[1]) goto LAB_00121133;
    if (tensor->ne[3] == 1) {
      if ((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_00->grad == (ggml_tensor *)0x0)) {
        gStack_170 = extraout_RDX_00->ne[0];
        iStack_16c = tensor->ne[2];
        uStack_168 = 0x100000001;
        pgStack_178 = (ggml_tensor *)0x12110a;
        pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_170,(void *)0x0);
        pgVar3->op = GGML_OP_CONV_1D_1S;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = tensor;
        pgVar3->src1 = extraout_RDX_00;
        return pgVar3;
      }
      goto LAB_0012112e;
    }
  }
  else {
    pgStack_178 = (ggml_tensor *)0x12112e;
    ggml_conv_1d_1s_cold_1();
LAB_0012112e:
    pgStack_178 = (ggml_tensor *)0x121133;
    ggml_conv_1d_1s_cold_4();
LAB_00121133:
    pgStack_178 = (ggml_tensor *)0x121138;
    ggml_conv_1d_1s_cold_2();
  }
  pgStack_178 = (ggml_tensor *)ggml_conv_1d_2s;
  ggml_conv_1d_1s_cold_3();
  pgStack_180 = pgVar4;
  pgStack_178 = pgVar3;
  if ((extraout_RDX_01->ne[2] == 1) && (extraout_RDX_01->ne[3] == 1)) {
    if (tensor->ne[1] == extraout_RDX_01->ne[1]) {
      if (tensor->ne[3] != 1) goto LAB_001211dd;
      if ((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_01->grad == (ggml_tensor *)0x0)) {
        iStack_198 = extraout_RDX_01->ne[0] / 2;
        iStack_194 = tensor->ne[2];
        uStack_190 = 0x100000001;
        pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&iStack_198,(void *)0x0);
        pgVar3->op = GGML_OP_CONV_1D_2S;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = tensor;
        pgVar3->src1 = extraout_RDX_01;
        return pgVar3;
      }
      goto LAB_001211d3;
    }
  }
  else {
    ggml_conv_1d_2s_cold_1();
LAB_001211d3:
    ggml_conv_1d_2s_cold_4();
  }
  ggml_conv_1d_2s_cold_2();
LAB_001211dd:
  ggml_conv_1d_2s_cold_3();
  if (((extraout_RDX_02->ne[0] == tensor->ne[0]) && (extraout_RDX_02->ne[2] == tensor->ne[2])) &&
     (extraout_RDX_02->ne[3] == tensor->ne[3])) {
    if (((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_02->grad == (ggml_tensor *)0x0)) &&
       (b->grad == (ggml_tensor *)0x0)) {
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,tensor->ne,(void *)0x0);
      pgVar3->op = GGML_OP_FLASH_ATTN;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = extraout_RDX_02;
      pgVar3->opt[0] = b;
      pgVar4 = ggml_new_i32(ctx,(uint)pgVar8 & 0xff);
      pgVar3->opt[1] = pgVar4;
      return pgVar3;
    }
  }
  else {
    ggml_flash_attn_cold_1();
  }
  ggml_flash_attn_cold_2();
  if (((extraout_RDX_03->ne[0] == tensor->ne[0]) && (extraout_RDX_03->ne[2] == tensor->ne[2])) &&
     (extraout_RDX_03->ne[3] == tensor->ne[3])) {
    if ((((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_03->grad == (ggml_tensor *)0x0)) &&
        (b->grad == (ggml_tensor *)0x0)) &&
       ((pgVar8->grad == (ggml_tensor *)0x0 && (pgVar10->grad == (ggml_tensor *)0x0)))) {
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,tensor->ne,(void *)0x0);
      pgVar3->op = GGML_OP_FLASH_FF;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = extraout_RDX_03;
      pgVar3->opt[0] = b;
      pgVar3->opt[1] = pgVar8;
      pgVar3->opt[2] = pgVar10;
      return pgVar3;
    }
    ggml_flash_ff_cold_2();
  }
  ggml_flash_ff_cold_1();
  tensor->is_param = true;
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,(void *)0x0);
    tensor->grad = pgVar3;
    return pgVar3;
  }
  ggml_set_param_cold_1();
  ggml_build_forward_impl((ggml_cgraph *)ctx,tensor,true);
  return extraout_RAX;
}

Assistant:

struct ggml_tensor * ggml_reshape(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b) {
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_is_contiguous(b));
    GGML_ASSERT(ggml_nelements(a) == ggml_nelements(b));

    bool is_node = false;

    if (a->grad || b->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, b->n_dims, b->ne, a->data);

    result->op   = GGML_OP_RESHAPE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}